

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

PixelBufferAccess * __thiscall
sglr::ReferenceContext::getFboAttachment
          (PixelBufferAccess *__return_storage_ptr__,ReferenceContext *this,Framebuffer *framebuffer
          ,AttachmentPoint point)

{
  int iVar1;
  deBool dVar2;
  Type TVar3;
  CubeFace face;
  int iVar4;
  int width;
  int height;
  int rowPitch;
  Attachment *pAVar5;
  Texture *this_00;
  TestError *pTVar6;
  PixelBufferAccess *pPVar7;
  void *pvVar8;
  TextureFormat *format;
  Renderbuffer *this_01;
  TextureCubeArray *local_108;
  Texture3D *local_f8;
  Texture2DArray *local_e8;
  TextureCube *local_c8;
  Texture2D *local_b8;
  Renderbuffer *rbo;
  void *layerData;
  PixelBufferAccess level;
  Texture *texture;
  Attachment *attachment;
  AttachmentPoint point_local;
  Framebuffer *framebuffer_local;
  ReferenceContext *this_local;
  
  pAVar5 = rc::Framebuffer::getAttachment(framebuffer,point);
  if (pAVar5->type == ATTACHMENTTYPE_RENDERBUFFER) {
    this_01 = rc::ObjectManager<sglr::rc::Renderbuffer>::find(&this->m_renderbuffers,pAVar5->name);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || (this_01 == (Renderbuffer *)0x0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"rbo",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0x941);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    rc::Renderbuffer::getAccess(__return_storage_ptr__,this_01);
  }
  else if (pAVar5->type == ATTACHMENTTYPE_TEXTURE) {
    this_00 = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,pAVar5->name);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || (this_00 == (Texture *)0x0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"texture",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0x923);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    TVar3 = rc::Texture::getType(this_00);
    if (TVar3 == TYPE_2D) {
      if (this_00 == (Texture *)0x0) {
        local_b8 = (Texture2D *)0x0;
      }
      else {
        local_b8 = (Texture2D *)
                   __dynamic_cast(this_00,&rc::Texture::typeinfo,&rc::Texture2D::typeinfo,0);
      }
      pPVar7 = rc::Texture2D::getLevel(local_b8,pAVar5->level);
      tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,pPVar7);
    }
    else {
      TVar3 = rc::Texture::getType(this_00);
      if (TVar3 == TYPE_CUBE_MAP) {
        if (this_00 == (Texture *)0x0) {
          local_c8 = (TextureCube *)0x0;
        }
        else {
          local_c8 = (TextureCube *)
                     __dynamic_cast(this_00,&rc::Texture::typeinfo,&rc::TextureCube::typeinfo,0);
        }
        iVar1 = pAVar5->level;
        face = texTargetToFace(pAVar5->texTarget);
        pPVar7 = rc::TextureCube::getFace(local_c8,iVar1,face);
        tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,pPVar7);
      }
      else {
        TVar3 = rc::Texture::getType(this_00);
        if (((TVar3 == TYPE_2D_ARRAY) || (TVar3 = rc::Texture::getType(this_00), TVar3 == TYPE_3D))
           || (TVar3 = rc::Texture::getType(this_00), TVar3 == TYPE_CUBE_MAP_ARRAY)) {
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&layerData);
          TVar3 = rc::Texture::getType(this_00);
          if (TVar3 == TYPE_2D_ARRAY) {
            if (this_00 == (Texture *)0x0) {
              local_e8 = (Texture2DArray *)0x0;
            }
            else {
              local_e8 = (Texture2DArray *)
                         __dynamic_cast(this_00,&rc::Texture::typeinfo,&rc::Texture2DArray::typeinfo
                                        ,0);
            }
            pPVar7 = rc::Texture2DArray::getLevel(local_e8,pAVar5->level);
            memcpy(&layerData,pPVar7,0x28);
          }
          else {
            TVar3 = rc::Texture::getType(this_00);
            if (TVar3 == TYPE_3D) {
              if (this_00 == (Texture *)0x0) {
                local_f8 = (Texture3D *)0x0;
              }
              else {
                local_f8 = (Texture3D *)
                           __dynamic_cast(this_00,&rc::Texture::typeinfo,&rc::Texture3D::typeinfo,0)
                ;
              }
              pPVar7 = rc::Texture3D::getLevel(local_f8,pAVar5->level);
              memcpy(&layerData,pPVar7,0x28);
            }
            else {
              TVar3 = rc::Texture::getType(this_00);
              if (TVar3 == TYPE_CUBE_MAP_ARRAY) {
                if (this_00 == (Texture *)0x0) {
                  local_108 = (TextureCubeArray *)0x0;
                }
                else {
                  local_108 = (TextureCubeArray *)
                              __dynamic_cast(this_00,&rc::Texture::typeinfo,
                                             &rc::TextureCubeArray::typeinfo,0);
                }
                pPVar7 = rc::TextureCubeArray::getLevel(local_108,pAVar5->level);
                memcpy(&layerData,pPVar7,0x28);
              }
            }
          }
          pvVar8 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&layerData);
          iVar4 = tcu::ConstPixelBufferAccess::getSlicePitch((ConstPixelBufferAccess *)&layerData);
          iVar1 = pAVar5->layer;
          format = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&layerData);
          width = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&layerData);
          height = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&layerData);
          rowPitch = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)&layerData);
          tcu::PixelBufferAccess::PixelBufferAccess
                    (__return_storage_ptr__,format,width,height,1,rowPitch,0,
                     (void *)((long)pvVar8 + (long)(iVar4 * iVar1)));
        }
        else {
          nullAccess();
        }
      }
    }
  }
  else {
    nullAccess();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess ReferenceContext::getFboAttachment (const rc::Framebuffer& framebuffer, rc::Framebuffer::AttachmentPoint point)
{
	const Framebuffer::Attachment& attachment = framebuffer.getAttachment(point);

	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);

			if (texture->getType() == Texture::TYPE_2D)
				return dynamic_cast<Texture2D*>(texture)->getLevel(attachment.level);
			else if (texture->getType() == Texture::TYPE_CUBE_MAP)
				return dynamic_cast<TextureCube*>(texture)->getFace(attachment.level, texTargetToFace(attachment.texTarget));
			else if (texture->getType() == Texture::TYPE_2D_ARRAY	||
					 texture->getType() == Texture::TYPE_3D			||
					 texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
			{
				tcu::PixelBufferAccess level;

				if (texture->getType() == Texture::TYPE_2D_ARRAY)
					level = dynamic_cast<Texture2DArray*>(texture)->getLevel(attachment.level);
				else if (texture->getType() == Texture::TYPE_3D)
					level = dynamic_cast<Texture3D*>(texture)->getLevel(attachment.level);
				else if (texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
					level = dynamic_cast<TextureCubeArray*>(texture)->getLevel(attachment.level);

				void* layerData = static_cast<deUint8*>(level.getDataPtr()) + level.getSlicePitch() * attachment.layer;

				return tcu::PixelBufferAccess(level.getFormat(), level.getWidth(), level.getHeight(), 1, level.getRowPitch(), 0, layerData);
			}
			else
				return nullAccess();
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);

			return rbo->getAccess();
		}

		default:
			return nullAccess();
	}
}